

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_ZONE(effect_handler_context_t *context)

{
  wchar_t wVar1;
  wchar_t typ;
  wchar_t wVar2;
  loc grid2;
  loc_conflict finish;
  wchar_t dam_00;
  wchar_t wVar3;
  source sVar4;
  source origin;
  wchar_t dist;
  wchar_t flg;
  wchar_t chance;
  wchar_t type;
  wchar_t rad;
  wchar_t dam;
  loc_conflict centre;
  loc_conflict grid;
  effect_handler_context_t *context_local;
  
  _rad = player->grid;
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  wVar1 = context->radius;
  typ = context->subtype;
  wVar2 = context->other;
  if ((context->x != L'\0') && (context->y != L'\0')) {
    _rad = loc(context->x,context->y);
  }
  for (centre.y = dam - wVar1; centre.y <= dam + wVar1; centre.y = centre.y + L'\x01') {
    for (centre.x = rad - wVar1; centre.x <= rad + wVar1; centre.x = centre.x + L'\x01') {
      grid2.y = centre.y;
      grid2.x = centre.x;
      wVar3 = distance(_rad,grid2);
      if ((wVar3 <= wVar1) && (wVar3 = Rand_div(100), wVar3 < wVar2)) {
        sVar4 = source_player();
        origin._4_4_ = 0;
        origin.what = sVar4.what;
        finish.y = centre.y;
        finish.x = centre.x;
        origin.which.trap = sVar4.which.trap;
        project(origin,L'\x01',finish,dam_00,typ,L'y',L'\0','\0',(object *)0x0);
      }
    }
  }
  return true;
}

Assistant:

bool effect_handler_ZONE(effect_handler_context_t *context)
{
	struct loc grid, centre = player->grid;
	int dam = effect_calculate_value(context, false);
	int rad = context->radius;
	int type = context->subtype;
	int chance = context->other;
	int flg = PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL |
		PROJECT_JUMP;

	/* Check for coordinates */
	if (context->x && context->y) {
		centre = loc(context->x, context->y);
	}

	/* Everything in range */
	for (grid.y = centre.y - rad; grid.y <= centre.y + rad; grid.y++) {
		for (grid.x = centre.x - rad; grid.x <= centre.x + rad; grid.x++) {
			int dist = distance(centre, grid);

			/* Skip distant grids */
			if (dist > rad) continue;

			/* Percentage chance of hitting */
			if (randint0(100) >= chance) continue;

			project(source_player(), 1, grid, dam, type, flg, 0, 0, NULL);
		}
	}
	return true;
}